

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.h
# Opt level: O2

void printTreeView(int id,int tabs)

{
  long lVar1;
  ostream *poVar2;
  long lVar3;
  char *pcVar4;
  
  lVar1 = (long)inodes[id].i_blocks[0] * 0x1000;
  for (lVar3 = 0; lVar3 != 0x1000; lVar3 = lVar3 + 0x100) {
    if (emptyspaces[lVar3 + lVar1] != '\0') {
      pcVar4 = emptyspaces + lVar3 + lVar1;
      printLines(tabs);
      poVar2 = std::operator<<((ostream *)&std::cout,pcVar4);
      std::endl<char,std::char_traits<char>>(poVar2);
      if ((inodes[*(int *)(emptyspaces + lVar3 + lVar1 + 0xfc)].i_mode == 1) &&
         ((*pcVar4 != '.' ||
          ((emptyspaces[lVar3 + lVar1 + 1] != '\0' &&
           ((emptyspaces[lVar3 + lVar1 + 1] != '.' || (emptyspaces[lVar3 + lVar1 + 2] != '\0')))))))
         ) {
        printTreeView(*(int *)(emptyspaces + lVar3 + lVar1 + 0xfc),tabs + 1);
      }
    }
  }
  return;
}

Assistant:

void printTreeView(int id, int tabs) {
    dir_block *p = getAddressByLocation_Folder(inodes[id].i_blocks[0]);
    int i;
    for (i = 0; i < 16; i++) {
        if (strcmp(p->dirs[i].name, "")) {
            printLines(tabs);
            cout << p->dirs[i].name << endl;
            int nextid = p->dirs[i].inode_id;
            if (inodes[nextid].i_mode == A_FOLDER && strcmp(p->dirs[i].name, ".") && strcmp(p->dirs[i].name, "..")) {
                printTreeView(nextid, tabs + 1);
            }
        }
    }
}